

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

char * strchrrep(char *haystack,char needle,char replacement)

{
  code *pcVar1;
  uint uVar2;
  size_t sVar4;
  char *pcVar5;
  int iVar3;
  
  if (haystack != (char *)0x0) {
    sVar4 = strlen(haystack);
    uVar2 = (uint)sVar4;
    pcVar5 = haystack;
    while (uVar2 != 0) {
      if (*pcVar5 == needle) {
        *pcVar5 = replacement;
      }
      iVar3 = (int)sVar4;
      uVar2 = iVar3 - 1;
      sVar4 = (size_t)uVar2;
      if (SBORROW4(iVar3,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      pcVar5 = pcVar5 + 1;
    }
  }
  return haystack;
}

Assistant:

char * strchrrep(char * haystack, char needle, char replacement)
{
	char *  c=0;
	int     length=0;

	if(!haystack)
		return haystack;

	for(c=haystack,length=strlen(haystack);length;length--,c++)
	{
		if(*c==needle)
			*c = replacement;
	}

	return haystack;
}